

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryGetParent
          (InMemoryDirectory *this,StringPtr name,WriteMode mode)

{
  char *pcVar1;
  EVP_PKEY_CTX *ctx;
  undefined8 uVar2;
  undefined4 in_register_0000000c;
  Directory *extraout_RDX;
  _Base_ptr p_Var3;
  char *pcVar4;
  ulong in_R8;
  _func_int **pp_Var5;
  InMemoryDirectory *pIVar6;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar7;
  StringPtr name_00;
  Fault f;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_88 [24];
  undefined8 *local_70;
  _Base_ptr p_Stack_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  _func_int **local_50;
  Date local_48;
  _Base_ptr local_40;
  char *local_38;
  
  local_58 = (_Base_ptr)CONCAT44(in_register_0000000c,mode);
  name_00.content.size_ = name.content.size_;
  pcVar4 = name.content.ptr;
  p_Var3 = (_Base_ptr)(pcVar4 + 0x18);
  local_88[0] = (kj)0x0;
  local_88._16_8_ = this;
  kj::_::Mutex::lock((Mutex *)p_Var3,0);
  pcVar1 = pcVar4 + 0x30;
  name_00.content.ptr = pcVar1;
  local_60 = p_Var3;
  local_40 = p_Var3;
  local_38 = pcVar1;
  Impl::openEntry((Impl *)local_88,name_00,(WriteMode)local_58);
  ctx = (EVP_PKEY_CTX *)CONCAT71(local_88._1_7_,local_88[0]);
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    if (*(int *)(ctx + 0x18) == 0) {
      uVar2 = (**(code **)**(undefined8 **)pcVar1)();
      *(undefined8 *)(pcVar4 + 0x70) = uVar2;
      newInMemoryDirectory
                ((kj *)local_88,*(Clock **)(pcVar4 + 0x30),*(InMemoryFileFactory **)(pcVar4 + 0x38))
      ;
      pIVar6 = (InMemoryDirectory *)local_88._16_8_;
      local_70 = (undefined8 *)CONCAT71(local_88._1_7_,local_88[0]);
      p_Stack_68 = (_Base_ptr)local_88._8_8_;
      EntryImpl::init((EntryImpl *)&local_50,ctx);
      (pIVar6->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = local_50;
      (((AtomicRefcounted *)((long)pIVar6 + 8))->super_Disposer)._vptr_Disposer =
           (_func_int **)local_48.value.value;
      local_48.value.value = (Quantity<long,_kj::_::NanosecondLabel>)0;
      if (p_Stack_68 != (_Base_ptr)0x0) {
        p_Stack_68 = (_Base_ptr)0x0;
        (**(code **)*local_70)();
      }
      goto LAB_004ee0a6;
    }
    if (*(int *)(ctx + 0x18) == 2) {
      (**(code **)(**(long **)(ctx + 0x28) + 0x28))(local_88);
      pIVar6 = (InMemoryDirectory *)local_88._16_8_;
      p_Var3 = (_Base_ptr)local_88._8_8_;
      if ((_Base_ptr)local_88._8_8_ == (_Base_ptr)0x0) {
        pp_Var5 = (_func_int **)0x0;
        p_Var3 = (_Base_ptr)0x0;
      }
      else {
        pp_Var5 = (_func_int **)CONCAT71(local_88._1_7_,local_88[0]);
        local_88._8_8_ = (_Base_ptr)0x0;
      }
      if ((_Base_ptr)local_88._8_8_ != (_Base_ptr)0x0) {
        local_88._8_8_ = (_Base_ptr)0x0;
        (*(code *)**(undefined8 **)CONCAT71(local_88._1_7_,local_88[0]))();
      }
      (pIVar6->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = pp_Var5;
      (((AtomicRefcounted *)((long)pIVar6 + 8))->super_Disposer)._vptr_Disposer =
           (_func_int **)p_Var3;
      goto LAB_004ee0a6;
    }
  }
  if ((in_R8 & 1) == 0) {
    (((Directory *)local_88._16_8_)->super_ReadableDirectory).super_FsNode._vptr_FsNode =
         (_func_int **)0x0;
    (((AtomicRefcounted *)(local_88._16_8_ + 8))->super_Disposer)._vptr_Disposer = (_func_int **)0x0
    ;
    pIVar6 = (InMemoryDirectory *)local_88._16_8_;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x6f1,FAILED,(char *)0x0,"\"parent is not a directory\"",
               (char (*) [26])"parent is not a directory");
    pIVar6 = (InMemoryDirectory *)local_88._16_8_;
    (((Directory *)local_88._16_8_)->super_ReadableDirectory).super_FsNode._vptr_FsNode =
         (_func_int **)0x0;
    (((AtomicRefcounted *)(local_88._16_8_ + 8))->super_Disposer)._vptr_Disposer = (_func_int **)0x0
    ;
    kj::_::Debug::Fault::~Fault((Fault *)local_88);
  }
LAB_004ee0a6:
  kj::_::Mutex::unlock((Mutex *)local_60,EXCLUSIVE,(Waiter *)0x0);
  MVar7.ptr.ptr = extraout_RDX;
  MVar7.ptr.disposer = (Disposer *)pIVar6;
  return (Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>)MVar7.ptr;
}

Assistant:

kj::Maybe<Own<const Directory>> tryGetParent(kj::StringPtr name, WriteMode mode) const {
    // Get a directory which is a parent of the eventual target. If `mode` includes
    // WriteMode::CREATE_PARENTS, possibly create the parent directory.

    auto lock = impl.lockExclusive();

    WriteMode parentMode = has(mode, WriteMode::CREATE) && has(mode, WriteMode::CREATE_PARENT)
        ? WriteMode::CREATE | WriteMode::MODIFY   // create parent
        : WriteMode::MODIFY;                      // don't create parent

    // Possibly create parent.
    KJ_IF_SOME(entry, lock->openEntry(name, parentMode)) {
      if (entry.node.is<DirectoryNode>()) {
        return entry.node.get<DirectoryNode>().directory->clone();
      } else if (entry.node == nullptr) {
        lock->modified();
        return entry.init(DirectoryNode { lock->newDirectory() });
      }
      // Continue on.
    }

    if (has(mode, WriteMode::CREATE)) {
      // CREATE is documented as returning null when the file already exists. In this case, the
      // file does NOT exist because the parent directory does not exist or is not a directory.
      KJ_FAIL_REQUIRE("parent is not a directory") { return kj::none; }
    } else {
      return kj::none;
    }
  }